

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O2

vm_obj_id_t __thiscall CVmTimeZone::get_name_list(CVmTimeZone *this)

{
  ZoneHashEntry *pZVar1;
  ZoneHashEntryLink *pZVar2;
  vm_datatype_t *pvVar3;
  vm_val_t *pvVar4;
  vm_obj_id_t vVar5;
  ZoneHashEntryLink **ppZVar6;
  size_t bytelen;
  size_t sVar7;
  char *__s;
  CVmObjPageEntry *this_00;
  vm_val_t ele;
  
  if (this->hashentry_ == (ZoneHashEntry *)0x0) {
    if (this->name_ == (char *)0x0) {
      sVar7 = 0;
      if (this->abbr_ != (char *)0x0) {
        sVar7 = (size_t)(*this->abbr_ != '\0');
      }
    }
    else {
      sVar7 = 1;
    }
  }
  else {
    sVar7 = 1;
    for (ppZVar6 = &this->hashentry_->link_from; *ppZVar6 != (ZoneHashEntryLink *)0x0;
        ppZVar6 = &(*ppZVar6)->link_nxt) {
      sVar7 = sVar7 + 1;
    }
  }
  vVar5 = CVmObjList::create(0,sVar7);
  pvVar4 = sp_;
  pvVar3 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar3 = VM_OBJ;
  (pvVar4->val).obj = vVar5;
  this_00 = G_obj_table_X.pages_[vVar5 >> 0xc] + (vVar5 & 0xfff);
  CVmObjList::cons_clear((CVmObjList *)this_00);
  pZVar1 = this->hashentry_;
  if (pZVar1 == (ZoneHashEntry *)0x0) {
    __s = this->name_;
    if ((__s != (char *)0x0) || ((__s = this->abbr_, __s != (char *)0x0 && (*__s != '\0')))) {
      bytelen = strlen(__s);
      ele.val.obj = CVmObjString::create(0,__s,bytelen);
      ele.typ = VM_OBJ;
      CVmObjList::cons_set_element((CVmObjList *)this_00,0,&ele);
    }
  }
  else {
    ele.val.obj = CVmObjString::create
                            (0,(pZVar1->super_CVmHashEntryCI).super_CVmHashEntry.str_,
                             (pZVar1->super_CVmHashEntryCI).super_CVmHashEntry.len_);
    ele.typ = VM_OBJ;
    CVmObjList::cons_set_element((CVmObjList *)this_00,0,&ele);
    ppZVar6 = &this->hashentry_->link_from;
    sVar7 = 1;
    while (pZVar2 = *ppZVar6, pZVar2 != (ZoneHashEntryLink *)0x0) {
      ele.val.obj = CVmObjString::create
                              (0,(pZVar2->super_ZoneHashEntry).super_CVmHashEntryCI.
                                 super_CVmHashEntry.str_,
                               (pZVar2->super_ZoneHashEntry).super_CVmHashEntryCI.super_CVmHashEntry
                               .len_);
      ele.typ = VM_OBJ;
      CVmObjList::cons_set_element((CVmObjList *)this_00,sVar7,&ele);
      sVar7 = sVar7 + 1;
      ppZVar6 = &pZVar2->link_nxt;
    }
  }
  sp_ = sp_ + -1;
  return vVar5;
}

Assistant:

vm_obj_id_t CVmTimeZone::get_name_list(VMG0_) const
{
    /* no names found so far */
    int cnt = 0;

    /* count names, depending on what information we have */
    if (hashentry_ != 0)
    {
        /* the hash entry gives us our primary name */
        cnt += 1;
        
        /* count incoming alias links */
        for (ZoneHashEntryLink *e = hashentry_->link_from ; e != 0 ;
             e = e->link_nxt, ++cnt) ;
    }
    else if (name_ != 0)
    {
        /* we have only the one primary name */
        cnt += 1;
    }
    else if (abbr_ != 0 && abbr_[0] != '\0')
    {
        /* no name, but we at least have an abbreviation we can use in lieu */
        cnt += 1;
    }

    /* allocate the result list; stack it for gc protection */
    vm_obj_id_t lstid = CVmObjList::create(vmg_ FALSE, cnt);
    G_stk->push()->set_obj(lstid);
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lstid);
    lst->cons_clear();

    /* start at index 0 */
    int idx = 0;
    vm_val_t ele;

    /* 
     *   add our primary name - this is our explicit name_ string, our hash
     *   entry name, or our primary abbreviation (in order of priority) 
     */
    if (hashentry_ != 0)
    {
        /* set the name from our hash entry */
        ele.set_obj(CVmObjString::create(
            vmg_ FALSE, hashentry_->getstr(), hashentry_->getlen()));
        lst->cons_set_element(idx++, &ele);

        /* add our aliases */
        for (ZoneHashEntryLink *link = hashentry_->link_from ; link != 0 ;
             link = link->link_nxt)
        {
            ele.set_obj(CVmObjString::create(
                vmg_ FALSE, link->getstr(), link->getlen()));
            lst->cons_set_element(idx++, &ele);
        }
    }
    else if (name_ != 0)
    {
        /* the first item is our primary name */
        ele.set_obj(CVmObjString::create(vmg_ FALSE, name_, strlen(name_)));
        lst->cons_set_element(idx++, &ele);
    }
    else if (abbr_ != 0 && abbr_[0] != '\0')
    {
        /* use our primary abbreviation as our name */
        ele.set_obj(CVmObjString::create(vmg_ FALSE, abbr_, strlen(abbr_)));
        lst->cons_set_element(idx++, &ele);
    }

    /* discard the gc protection */
    G_stk->discard();

    /* return the new list object */
    return lstid;
}